

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryReverse(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  undefined8 pArr_00;
  JavascriptArray *obj_00;
  bool bVar3;
  uint32 length_00;
  undefined4 *puVar4;
  Var pvVar5;
  uint64 length_01;
  int in_stack_00000010;
  undefined1 local_78 [8];
  ArgumentReader args;
  BigIndex length;
  CallInfo callInfo_local;
  JsReentLock jsReentLock;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length.bigIndex = (uint64)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)length.bigIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x15a5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b87cfa;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_78 = (undefined1  [8])length.bigIndex;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_78,(CallInfo *)&length.bigIndex);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  callInfo_local = (CallInfo)pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = *(bool *)((long)callInfo_local + 0x108);
  *(bool *)((long)callInfo_local + 0x108) = true;
  if ((length.bigIndex & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x15a9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b87cfa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)local_78 & 0xffffff) != 0) {
    BigIndex::BigIndex((BigIndex *)&args.super_Arguments.Values,0);
    jsReentLock.m_savedNoJsReentrancy = false;
    jsReentLock._25_7_ = 0;
    pArr = (JavascriptArray *)0x0;
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar5 = Arguments::operator[]((Arguments *)local_78,0);
    TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
              (pvVar5,pSVar1,L"Array.prototype.reverse",
               (JavascriptArray **)&jsReentLock.m_savedNoJsReentrancy,(RecyclableObject **)&pArr,
               (BigIndex *)&args.super_Arguments.Values);
    JsReentLock::MutateArrayObject((JsReentLock *)&callInfo_local);
    obj_00 = pArr;
    pArr_00 = jsReentLock._24_8_;
    *(undefined1 *)((long)callInfo_local + 0x108) = 1;
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if ((int)args.super_Arguments.Values == -1) {
      length_01 = BigIndex::GetBigIndex((BigIndex *)&args.super_Arguments.Values);
      pvVar5 = ReverseHelper<unsigned_long>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_01,pSVar1);
    }
    else {
      length_00 = BigIndex::GetSmallIndex((BigIndex *)&args.super_Arguments.Values);
      pvVar5 = ReverseHelper<unsigned_int>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_00,pSVar1);
    }
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    return pvVar5;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.reverse");
}

Assistant:

Var JavascriptArray::EntryReverse(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Reverse);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.reverse"));
        }

        BigIndex length = 0u;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.reverse"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReverseHelper(pArr, nullptr, obj, length.GetSmallIndex(), scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReverseHelper(pArr, nullptr, obj, length.GetBigIndex(), scriptContext));
        JIT_HELPER_END(Array_Reverse);
    }